

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream_LstFuncs.h
# Opt level: O0

UINT8 ADrvLst_Clear(ADRV_LIST **headPtr)

{
  ADRV_LIST *pAVar1;
  ADRV_LIST *lastLstItm;
  ADRV_LIST *curLstItem;
  ADRV_LIST **headPtr_local;
  
  lastLstItm = *headPtr;
  *headPtr = (ADRV_LIST *)0x0;
  while (lastLstItm != (ADRV_LIST *)0x0) {
    pAVar1 = lastLstItm->next;
    free(lastLstItm);
    lastLstItm = pAVar1;
  }
  return '\0';
}

Assistant:

static UINT8 ADrvLst_Clear(ADRV_LIST** headPtr)
{
	ADRV_LIST* curLstItem;
	ADRV_LIST* lastLstItm;
	
	curLstItem = *headPtr;
	*headPtr = NULL;
	while(curLstItem != NULL)
	{
		lastLstItm = curLstItem;
		curLstItem = curLstItem->next;
		free(lastLstItm);
	}
	return 0x00;
}